

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

NodeText *
kj::_::
CopyConstructArray_<capnp::(anonymous_namespace)::CapnpcCppMain::NodeText,_capnp::(anonymous_namespace)::CapnpcCppMain::NodeText_*,_true,_false>
::apply(NodeText *pos,NodeText *start,NodeText *end)

{
  NodeText *params;
  NodeText *end_local;
  NodeText *start_local;
  NodeText *pos_local;
  
  end_local = start;
  start_local = pos;
  while (end_local != end) {
    params = mv<capnp::(anonymous_namespace)::CapnpcCppMain::NodeText>(end_local);
    ctor<capnp::(anonymous_namespace)::CapnpcCppMain::NodeText,capnp::(anonymous_namespace)::CapnpcCppMain::NodeText>
              (start_local,params);
    end_local = end_local + 1;
    start_local = start_local + 1;
  }
  return start_local;
}

Assistant:

static T* apply(T* __restrict__ pos, Iterator start, Iterator end) {
    // Verify that T can be *implicitly* constructed from the source values.
    if (false) implicitCast<T>(kj::mv(*start));

    if (noexcept(T(kj::mv(*start)))) {
      while (start != end) {
        ctor(*pos++, kj::mv(*start++));
      }
      return pos;
    } else {
      // Crap.  This is complicated.
      ExceptionGuard guard(pos);
      while (start != end) {
        ctor(*guard.pos, kj::mv(*start++));
        ++guard.pos;
      }
      guard.start = guard.pos;
      return guard.pos;
    }
  }